

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substring.cpp
# Opt level: O3

void duckdb::SubstringFunction<duckdb::SubstringUnicodeOp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  VectorType VVar2;
  unsigned_long *puVar3;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var4;
  data_ptr_t pdVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  sel_t *psVar7;
  sel_t *psVar8;
  byte bVar9;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  SelectionVector *pSVar12;
  reference vector;
  reference vector_00;
  reference this;
  idx_t iVar13;
  TemplatedValidityData<unsigned_long> *pTVar14;
  _Head_base<0UL,_unsigned_long_*,_false> _Var15;
  idx_t iVar16;
  ulong uVar17;
  undefined8 uVar18;
  idx_t iVar20;
  anon_union_16_2_67f50693_for_value *paVar21;
  long lVar22;
  idx_t iVar23;
  ulong uVar24;
  ulong uVar25;
  Vector *pVVar26;
  ulong uVar27;
  idx_t iVar28;
  int64_t offset;
  int64_t in_R9;
  idx_t idx_in_entry;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  data_ptr_t pdVar32;
  data_ptr_t pdVar33;
  data_ptr_t pdVar34;
  string_t sVar35;
  anon_struct_16_3_d7536bce_for_pointer aVar36;
  string_t input;
  string_t input_00;
  string_t input_01;
  string_t input_02;
  string_t input_03;
  string_t input_04;
  string_t input_05;
  string_t input_06;
  string_t input_07;
  string_t input_08;
  string_t input_09;
  string_t input_10;
  string_t input_11;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  idx_t local_158;
  element_type *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_120;
  idx_t local_110;
  UnifiedVectorFormat local_108;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  undefined8 uVar19;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  if ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start == 0x138) {
    this = vector<duckdb::Vector,_true>::operator[](&args->data,2);
    iVar23 = args->count;
    if (((vector->vector_type != CONSTANT_VECTOR) || (vector_00->vector_type != CONSTANT_VECTOR)) ||
       (this->vector_type != CONSTANT_VECTOR)) {
      Vector::SetVectorType(result,FLAT_VECTOR);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_108);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
      Vector::ToUnifiedFormat(vector,iVar23,&local_c0);
      Vector::ToUnifiedFormat(vector_00,iVar23,&local_108);
      Vector::ToUnifiedFormat(this,iVar23,&local_78);
      pdVar5 = local_78.data;
      pSVar12 = local_78.sel;
      pdVar34 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) &&
          (local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0)) &&
         (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0)) {
        if (iVar23 != 0) {
          pdVar34 = pdVar34 + 8;
          iVar20 = 0;
          do {
            iVar13 = iVar20;
            if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
              iVar13 = (idx_t)(local_c0.sel)->sel_vector[iVar20];
            }
            iVar16 = iVar20;
            if ((local_108.sel)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(local_108.sel)->sel_vector[iVar20];
            }
            _Var4._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (((unsafe_unique_array<unsigned_long> *)&pSVar12->sel_vector)->
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
            iVar28 = iVar20;
            if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                _Var4._M_t.
                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0)
            {
              iVar28 = (idx_t)*(uint *)((long)_Var4._M_t.
                                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                              .super__Head_base<0UL,_unsigned_long_*,_false>.
                                              _M_head_impl + iVar20 * 4);
            }
            input.value.pointer.ptr = (char *)*(undefined8 *)(local_108.data + iVar16 * 8);
            input.value._0_8_ = *(undefined8 *)(local_c0.data + iVar13 * 0x10 + 8);
            sVar35 = SubstringUnicode((duckdb *)result,*(Vector **)(local_c0.data + iVar13 * 0x10),
                                      input,(int64_t)((_func_int ***)pdVar5)[iVar28],in_R9);
            *(long *)(pdVar34 + -8) = sVar35.value._0_8_;
            *(long *)pdVar34 = sVar35.value._8_8_;
            iVar20 = iVar20 + 1;
            pdVar34 = pdVar34 + 0x10;
          } while (iVar23 != iVar20);
        }
      }
      else if (iVar23 != 0) {
        pdVar34 = pdVar34 + 8;
        uVar31 = 0;
        do {
          uVar25 = uVar31;
          if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
            uVar25 = (ulong)(local_c0.sel)->sel_vector[uVar31];
          }
          uVar17 = uVar31;
          if ((local_108.sel)->sel_vector != (sel_t *)0x0) {
            uVar17 = (ulong)(local_108.sel)->sel_vector[uVar31];
          }
          _Var4._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
          super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (((unsafe_unique_array<unsigned_long> *)&pSVar12->sel_vector)->
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
          uVar30 = uVar31;
          if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
              _Var4._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
            uVar30 = (ulong)*(uint *)((long)_Var4._M_t.
                                            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                            .super__Head_base<0UL,_unsigned_long_*,_false>.
                                            _M_head_impl + uVar31 * 4);
          }
          if ((((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                 (unsigned_long *)0x0) ||
               ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar25 >> 6] >> (uVar25 & 0x3f) & 1) != 0)) &&
              ((local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0 ||
               ((local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar17 >> 6] >> (uVar17 & 0x3f) & 1) != 0)))) &&
             ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0 ||
              ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                [uVar30 >> 6] >> (uVar30 & 0x3f) & 1) != 0)))) {
            input_02.value.pointer.ptr = (char *)*(undefined8 *)(local_108.data + uVar17 * 8);
            input_02.value._0_8_ = *(undefined8 *)(local_c0.data + uVar25 * 0x10 + 8);
            sVar35 = SubstringUnicode((duckdb *)result,*(Vector **)(local_c0.data + uVar25 * 0x10),
                                      input_02,(int64_t)((_func_int ***)pdVar5)[uVar30],in_R9);
            *(long *)(pdVar34 + -8) = sVar35.value._0_8_;
            *(long *)pdVar34 = sVar35.value._8_8_;
          }
          else {
            _Var15._M_head_impl =
                 (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (_Var15._M_head_impl == (unsigned_long *)0x0) {
              local_110 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_128,&local_110);
              p_Var11 = p_Stack_120;
              peVar10 = local_128;
              local_128 = (element_type *)0x0;
              p_Stack_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var6 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar10;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var11;
              if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                 p_Stack_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_120);
              }
              pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              _Var15._M_head_impl =
                   (pTVar14->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var15._M_head_impl;
            }
            bVar9 = (byte)uVar31 & 0x3f;
            _Var15._M_head_impl[uVar31 >> 6] =
                 _Var15._M_head_impl[uVar31 >> 6] &
                 (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
          }
          uVar31 = uVar31 + 1;
          pdVar34 = pdVar34 + 0x10;
        } while (iVar23 != uVar31);
      }
      if (local_78.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
LAB_009ebc55:
      if (local_108.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_108.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_c0.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c0.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return;
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
      return;
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
        ((puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
         puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) &&
       ((puVar3 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
      paVar21 = (anon_union_16_2_67f50693_for_value *)result->data;
      pVVar26 = *(Vector **)vector->data;
      uVar19 = *(undefined8 *)(vector->data + 8);
      uVar18 = *(undefined8 *)vector_00->data;
      offset = *(int64_t *)this->data;
LAB_009ebcb4:
      input_03.value.pointer.ptr = (char *)uVar18;
      input_03.value._0_8_ = uVar19;
      aVar36 = (anon_struct_16_3_d7536bce_for_pointer)
               SubstringUnicode((duckdb *)result,pVVar26,input_03,offset,in_R9);
      paVar21->pointer = aVar36;
      return;
    }
  }
  else {
    VVar1 = vector->vector_type;
    VVar2 = vector_00->vector_type;
    if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      paVar21 = (anon_union_16_2_67f50693_for_value *)result->data;
      if (((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
         ((puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
          puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
        pVVar26 = *(Vector **)vector->data;
        uVar19 = *(undefined8 *)(vector->data + 8);
        uVar18 = *(undefined8 *)vector_00->data;
        offset = 0xffffffff;
        goto LAB_009ebcb4;
      }
    }
    else {
      local_158 = args->count;
      if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
        pdVar34 = vector_00->data;
        puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar5 = vector->data;
        if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar32 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                     &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (local_158 == 0) {
              return;
            }
            uVar19 = *(undefined8 *)pdVar34;
            lVar22 = 8;
            do {
              input_07.value.pointer.ptr = (char *)uVar19;
              input_07.value._0_8_ = *(undefined8 *)(pdVar5 + lVar22);
              sVar35 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar5 + lVar22 + -8),input_07
                                        ,0xffffffff,in_R9);
              *(long *)(pdVar32 + lVar22 + -8) = sVar35.value._0_8_;
              *(long *)(pdVar32 + lVar22) = sVar35.value._8_8_;
              lVar22 = lVar22 + 0x10;
              local_158 = local_158 - 1;
            } while (local_158 != 0);
            return;
          }
          if (local_158 + 0x3f < 0x40) {
            return;
          }
          uVar25 = 0;
          uVar31 = 0;
          do {
            puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar3 == (unsigned_long *)0x0) {
              uVar17 = uVar25 + 0x40;
              if (local_158 <= uVar25 + 0x40) {
                uVar17 = local_158;
              }
LAB_009eb9f1:
              uVar27 = uVar25;
              if (uVar25 < uVar17) {
                uVar19 = *(undefined8 *)pdVar34;
                uVar30 = uVar25 << 4 | 8;
                do {
                  input_01.value.pointer.ptr = (char *)uVar19;
                  input_01.value._0_8_ = *(undefined8 *)(pdVar5 + uVar30);
                  sVar35 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar5 + (uVar30 - 8)),
                                            input_01,0xffffffff,in_R9);
                  *(long *)(pdVar32 + (uVar30 - 8)) = sVar35.value._0_8_;
                  *(long *)(pdVar32 + uVar30) = sVar35.value._8_8_;
                  uVar25 = uVar25 + 1;
                  uVar30 = uVar30 + 0x10;
                  uVar27 = uVar17;
                } while (uVar17 != uVar25);
              }
            }
            else {
              uVar30 = puVar3[uVar31];
              uVar17 = uVar25 + 0x40;
              if (local_158 <= uVar25 + 0x40) {
                uVar17 = local_158;
              }
              uVar27 = uVar17;
              if (uVar30 != 0) {
                if (uVar30 == 0xffffffffffffffff) goto LAB_009eb9f1;
                uVar27 = uVar25;
                if (uVar25 < uVar17) {
                  uVar24 = uVar25 << 4 | 8;
                  uVar29 = 0;
                  do {
                    if ((uVar30 >> (uVar29 & 0x3f) & 1) != 0) {
                      input_00.value.pointer.ptr = (char *)*(undefined8 *)pdVar34;
                      input_00.value._0_8_ = *(undefined8 *)(pdVar5 + uVar24);
                      sVar35 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar5 + (uVar24 - 8))
                                                ,input_00,0xffffffff,in_R9);
                      *(long *)(pdVar32 + (uVar24 - 8)) = sVar35.value._0_8_;
                      *(long *)(pdVar32 + uVar24) = sVar35.value._8_8_;
                    }
                    uVar29 = uVar29 + 1;
                    uVar24 = uVar24 + 0x10;
                    uVar27 = uVar17;
                  } while (uVar17 - uVar25 != uVar29);
                }
              }
            }
            uVar25 = uVar27;
            uVar31 = uVar31 + 1;
            if (uVar31 == local_158 + 0x3f >> 6) {
              return;
            }
          } while( true );
        }
      }
      else {
        if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
          if (VVar2 == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
            pdVar34 = vector->data;
            pdVar5 = vector_00->data;
            Vector::SetVectorType(result,FLAT_VECTOR);
            pdVar32 = result->data;
            FlatVector::VerifyFlatVector(result);
            FlatVector::VerifyFlatVector(vector);
            FlatVector::VerifyFlatVector(result);
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                       &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data)
            ;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
                 (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            FlatVector::VerifyFlatVector(vector_00);
            ValidityMask::Combine(&result->validity,&vector_00->validity,local_158);
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              if (local_158 == 0) {
                return;
              }
              lVar22 = 0;
              do {
                sVar35.value.pointer.ptr = (char *)*(undefined8 *)(pdVar5 + lVar22);
                sVar35.value._0_8_ = *(undefined8 *)(pdVar34 + lVar22 * 2 + 8);
                sVar35 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar34 + lVar22 * 2),sVar35
                                          ,0xffffffff,in_R9);
                *(long *)(pdVar32 + lVar22 * 2) = sVar35.value._0_8_;
                *(long *)(pdVar32 + lVar22 * 2 + 8) = sVar35.value._8_8_;
                lVar22 = lVar22 + 8;
                local_158 = local_158 - 1;
              } while (local_158 != 0);
              return;
            }
            if (local_158 + 0x3f < 0x40) {
              return;
            }
            uVar25 = 0;
            uVar31 = 0;
            do {
              puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar3 == (unsigned_long *)0x0) {
                uVar17 = uVar31 + 0x40;
                if (local_158 <= uVar31 + 0x40) {
                  uVar17 = local_158;
                }
LAB_009ec155:
                uVar27 = uVar31;
                if (uVar31 < uVar17) {
                  uVar30 = uVar31 << 4 | 8;
                  do {
                    input_09.value.pointer.ptr = (char *)*(undefined8 *)(pdVar5 + uVar31 * 8);
                    input_09.value._0_8_ = *(undefined8 *)(pdVar34 + uVar30);
                    sVar35 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar34 + (uVar30 - 8)),
                                              input_09,0xffffffff,in_R9);
                    *(long *)(pdVar32 + (uVar30 - 8)) = sVar35.value._0_8_;
                    *(long *)(pdVar32 + uVar30) = sVar35.value._8_8_;
                    uVar31 = uVar31 + 1;
                    uVar30 = uVar30 + 0x10;
                    uVar27 = uVar17;
                  } while (uVar17 != uVar31);
                }
              }
              else {
                uVar30 = puVar3[uVar25];
                uVar17 = uVar31 + 0x40;
                if (local_158 <= uVar31 + 0x40) {
                  uVar17 = local_158;
                }
                uVar27 = uVar17;
                if (uVar30 != 0) {
                  if (uVar30 == 0xffffffffffffffff) goto LAB_009ec155;
                  uVar27 = uVar31;
                  if (uVar31 < uVar17) {
                    uVar29 = uVar31 << 4 | 8;
                    uVar24 = 0;
                    do {
                      if ((uVar30 >> (uVar24 & 0x3f) & 1) != 0) {
                        input_08.value.pointer.ptr =
                             (char *)*(undefined8 *)(pdVar5 + uVar24 * 8 + uVar31 * 8);
                        input_08.value._0_8_ = *(undefined8 *)(pdVar34 + uVar29);
                        sVar35 = SubstringUnicode((duckdb *)result,
                                                  *(Vector **)(pdVar34 + (uVar29 - 8)),input_08,
                                                  0xffffffff,in_R9);
                        *(long *)(pdVar32 + (uVar29 - 8)) = sVar35.value._0_8_;
                        *(long *)(pdVar32 + uVar29) = sVar35.value._8_8_;
                      }
                      uVar24 = uVar24 + 1;
                      uVar29 = uVar29 + 0x10;
                      uVar27 = uVar17;
                    } while (uVar17 - uVar31 != uVar24);
                  }
                }
              }
              uVar25 = uVar25 + 1;
              uVar31 = uVar27;
              if (uVar25 == local_158 + 0x3f >> 6) {
                return;
              }
            } while( true );
          }
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_108);
          Vector::ToUnifiedFormat(vector,local_158,&local_c0);
          Vector::ToUnifiedFormat(vector_00,local_158,&local_108);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar34 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (local_158 != 0) {
              psVar7 = (local_c0.sel)->sel_vector;
              psVar8 = (local_108.sel)->sel_vector;
              pdVar34 = pdVar34 + 8;
              iVar23 = 0;
              do {
                iVar20 = iVar23;
                if (psVar7 != (sel_t *)0x0) {
                  iVar20 = (idx_t)psVar7[iVar23];
                }
                iVar13 = iVar23;
                if (psVar8 != (sel_t *)0x0) {
                  iVar13 = (idx_t)psVar8[iVar23];
                }
                input_04.value.pointer.ptr = (char *)*(undefined8 *)(local_108.data + iVar13 * 8);
                input_04.value._0_8_ = *(undefined8 *)(local_c0.data + iVar20 * 0x10 + 8);
                sVar35 = SubstringUnicode((duckdb *)result,
                                          *(Vector **)(local_c0.data + iVar20 * 0x10),input_04,
                                          0xffffffff,in_R9);
                *(long *)(pdVar34 + -8) = sVar35.value._0_8_;
                *(long *)pdVar34 = sVar35.value._8_8_;
                iVar23 = iVar23 + 1;
                pdVar34 = pdVar34 + 0x10;
              } while (local_158 != iVar23);
            }
          }
          else if (local_158 != 0) {
            psVar7 = (local_c0.sel)->sel_vector;
            psVar8 = (local_108.sel)->sel_vector;
            pdVar34 = pdVar34 + 8;
            uVar31 = 0;
            do {
              uVar25 = uVar31;
              if (psVar7 != (sel_t *)0x0) {
                uVar25 = (ulong)psVar7[uVar31];
              }
              uVar17 = uVar31;
              if (psVar8 != (sel_t *)0x0) {
                uVar17 = (ulong)psVar8[uVar31];
              }
              if (((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar25 >> 6] >> (uVar25 & 0x3f) & 1) != 0)) &&
                 ((local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar17 >> 6] >> (uVar17 & 0x3f) & 1) != 0)))) {
                input_10.value.pointer.ptr = (char *)*(undefined8 *)(local_108.data + uVar17 * 8);
                input_10.value._0_8_ = *(undefined8 *)(local_c0.data + uVar25 * 0x10 + 8);
                sVar35 = SubstringUnicode((duckdb *)result,
                                          *(Vector **)(local_c0.data + uVar25 * 0x10),input_10,
                                          0xffffffff,in_R9);
                *(long *)(pdVar34 + -8) = sVar35.value._0_8_;
                *(long *)pdVar34 = sVar35.value._8_8_;
              }
              else {
                _Var15._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var15._M_head_impl == (unsigned_long *)0x0) {
                  local_128 = (element_type *)
                              (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity
                  ;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_78,(unsigned_long *)&local_128);
                  pdVar5 = local_78.data;
                  pSVar12 = local_78.sel;
                  local_78.sel = (SelectionVector *)0x0;
                  local_78.data = (data_ptr_t)0x0;
                  p_Var6 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)pSVar12;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar5;
                  if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data !=
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data);
                  }
                  pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  _Var15._M_head_impl =
                       (pTVar14->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var15._M_head_impl;
                }
                bVar9 = (byte)uVar31 & 0x3f;
                _Var15._M_head_impl[uVar31 >> 6] =
                     _Var15._M_head_impl[uVar31 >> 6] &
                     (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
              }
              uVar31 = uVar31 + 1;
              pdVar34 = pdVar34 + 0x10;
            } while (local_158 != uVar31);
          }
          goto LAB_009ebc55;
        }
        pdVar34 = vector->data;
        puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar5 = vector_00->data;
        if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar32 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector_00);
          FlatVector::VerifyFlatVector(result);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                     &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                    );
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
               (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (local_158 == 0) {
              return;
            }
            pVVar26 = *(Vector **)pdVar34;
            uVar19 = *(undefined8 *)(pdVar34 + 8);
            pdVar32 = pdVar32 + 8;
            iVar23 = 0;
            do {
              input_11.value.pointer.ptr = (char *)*(undefined8 *)(pdVar5 + iVar23 * 8);
              input_11.value._0_8_ = uVar19;
              sVar35 = SubstringUnicode((duckdb *)result,pVVar26,input_11,0xffffffff,in_R9);
              *(long *)(pdVar32 + -8) = sVar35.value._0_8_;
              *(long *)pdVar32 = sVar35.value._8_8_;
              iVar23 = iVar23 + 1;
              pdVar32 = pdVar32 + 0x10;
            } while (local_158 != iVar23);
            return;
          }
          if (local_158 + 0x3f < 0x40) {
            return;
          }
          uVar25 = 0;
          uVar31 = 0;
          do {
            puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar3 == (unsigned_long *)0x0) {
              uVar17 = uVar31 + 0x40;
              if (local_158 <= uVar31 + 0x40) {
                uVar17 = local_158;
              }
LAB_009ebf09:
              uVar27 = uVar31;
              if (uVar31 < uVar17) {
                pVVar26 = *(Vector **)pdVar34;
                uVar19 = *(undefined8 *)(pdVar34 + 8);
                pdVar33 = pdVar32 + uVar31 * 0x10 + 8;
                do {
                  input_06.value.pointer.ptr = (char *)*(undefined8 *)(pdVar5 + uVar31 * 8);
                  input_06.value._0_8_ = uVar19;
                  sVar35 = SubstringUnicode((duckdb *)result,pVVar26,input_06,0xffffffff,in_R9);
                  *(long *)(pdVar33 + -8) = sVar35.value._0_8_;
                  *(long *)pdVar33 = sVar35.value._8_8_;
                  uVar31 = uVar31 + 1;
                  pdVar33 = pdVar33 + 0x10;
                  uVar27 = uVar17;
                } while (uVar17 != uVar31);
              }
            }
            else {
              uVar30 = puVar3[uVar25];
              uVar17 = uVar31 + 0x40;
              if (local_158 <= uVar31 + 0x40) {
                uVar17 = local_158;
              }
              uVar27 = uVar17;
              if (uVar30 != 0) {
                if (uVar30 == 0xffffffffffffffff) goto LAB_009ebf09;
                uVar27 = uVar31;
                if (uVar31 < uVar17) {
                  pdVar33 = pdVar32 + uVar31 * 0x10 + 8;
                  uVar24 = 0;
                  do {
                    if ((uVar30 >> (uVar24 & 0x3f) & 1) != 0) {
                      input_05.value.pointer.ptr =
                           (char *)*(undefined8 *)(pdVar5 + uVar24 * 8 + uVar31 * 8);
                      input_05.value._0_8_ = *(undefined8 *)(pdVar34 + 8);
                      sVar35 = SubstringUnicode((duckdb *)result,*(Vector **)pdVar34,input_05,
                                                0xffffffff,in_R9);
                      *(long *)(pdVar33 + -8) = sVar35.value._0_8_;
                      *(long *)pdVar33 = sVar35.value._8_8_;
                    }
                    uVar24 = uVar24 + 1;
                    pdVar33 = pdVar33 + 0x10;
                    uVar27 = uVar17;
                  } while (uVar17 - uVar31 != uVar24);
                }
              }
            }
            uVar25 = uVar25 + 1;
            uVar31 = uVar27;
            if (uVar25 == local_158 + 0x3f >> 6) {
              return;
            }
          } while( true );
        }
      }
      Vector::SetVectorType(result,CONSTANT_VECTOR);
    }
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void SubstringFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &input_vector = args.data[0];
	auto &offset_vector = args.data[1];
	if (args.ColumnCount() == 3) {
		auto &length_vector = args.data[2];

		TernaryExecutor::Execute<string_t, int64_t, int64_t, string_t>(
		    input_vector, offset_vector, length_vector, result, args.size(),
		    [&](string_t input_string, int64_t offset, int64_t length) {
			    return OP::Substring(result, input_string, offset, length);
		    });
	} else {
		BinaryExecutor::Execute<string_t, int64_t, string_t>(
		    input_vector, offset_vector, result, args.size(), [&](string_t input_string, int64_t offset) {
			    return OP::Substring(result, input_string, offset, NumericLimits<uint32_t>::Maximum());
		    });
	}
}